

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::PushFocusScope(ImGuiID id)

{
  ImGuiContext *pIVar1;
  ImGuiID in_EDI;
  ImGuiID local_14;
  
  pIVar1 = GImGui;
  local_14 = in_EDI;
  ImVector<unsigned_int>::push_back(&GImGui->FocusScopeStack,&local_14);
  pIVar1->CurrentFocusScopeId = local_14;
  return;
}

Assistant:

void ImGui::PushFocusScope(ImGuiID id)
{
    ImGuiContext& g = *GImGui;
    g.FocusScopeStack.push_back(id);
    g.CurrentFocusScopeId = id;
}